

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O3

BigInt * __thiscall BigInt::operator*(BigInt *__return_storage_ptr__,BigInt *this,BigInt *v)

{
  iterator iVar1;
  pointer plVar2;
  long lVar3;
  pointer plVar4;
  iterator __position;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  vll b;
  vll a;
  vll c;
  vector<long_long,_std::allocator<long_long>_> b6;
  vector<long_long,_std::allocator<long_long>_> a6;
  vector<long_long,_std::allocator<long_long>_> local_f0;
  vector<long_long,_std::allocator<long_long>_> local_d8;
  vll local_c0;
  vector<long_long,_std::allocator<long_long>_> local_a8;
  BigInt *local_88;
  vector<long_long,_std::allocator<long_long>_> local_80;
  vector<long_long,_std::allocator<long_long>_> local_68;
  BigInt local_50;
  
  convert_base(&local_68,&this->vector_value,base_digits,6);
  convert_base(&local_80,&v->vector_value,base_digits,6);
  std::vector<long_long,std::allocator<long_long>>::
  vector<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,void>
            ((vector<long_long,std::allocator<long_long>> *)&local_d8,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             local_68.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             local_68.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&local_f0);
  std::vector<long_long,std::allocator<long_long>>::
  vector<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,void>
            ((vector<long_long,std::allocator<long_long>> *)&local_f0,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             local_80.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             local_80.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&local_c0);
  uVar5 = (long)local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar6 = (long)local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  iVar1._M_current =
       local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  plVar2 = local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar4 = local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar5 < uVar6) {
    do {
      local_c0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      if (local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                  (&local_d8,
                   (iterator)
                   local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(longlong *)&local_c0);
        iVar1._M_current =
             local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        plVar2 = local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        plVar4 = local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        *local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
         super__Vector_impl_data._M_finish = 0;
        local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar5 = (long)local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)plVar2;
      uVar6 = (long)iVar1._M_current - (long)plVar4;
    } while (uVar5 < uVar6);
  }
  __position._M_current =
       local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (uVar6 < uVar5) {
    do {
      local_c0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      if (iVar1._M_current ==
          local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                  (&local_f0,iVar1,(longlong *)&local_c0);
        plVar2 = local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        plVar4 = local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __position._M_current =
             local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        *iVar1._M_current = 0;
        local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
    } while ((ulong)((long)local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)plVar4) <
             (ulong)((long)__position._M_current - (long)plVar2));
  }
  local_88 = this;
  while (uVar5 = (long)__position._M_current - (long)plVar2 >> 3, (uVar5 & uVar5 - 1) != 0) {
    local_c0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (__position._M_current ==
        local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                (&local_d8,__position,(longlong *)&local_c0);
    }
    else {
      *__position._M_current = 0;
      local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                (&local_f0,
                 (iterator)
                 local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,(longlong *)&local_a8);
      plVar2 = local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      __position._M_current =
           local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      plVar2 = local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      __position._M_current =
           local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
  }
  karatsubaMultiply(&local_c0,&local_d8,&local_f0);
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->sign = v->sign * local_88->sign;
  if (0 < (int)((ulong)((long)local_c0.super__Vector_base<long_long,_std::allocator<long_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_c0.super__Vector_base<long_long,_std::allocator<long_long>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar7 = 0;
    lVar8 = 0;
    plVar2 = local_c0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar4 = local_c0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      lVar3 = (long)(int)lVar8 + plVar2[lVar7];
      lVar8 = lVar3 / 1000000;
      local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(lVar3 % 1000000);
      iVar1._M_current =
           (__return_storage_ptr__->vector_value).
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->vector_value).
          super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                  (&__return_storage_ptr__->vector_value,iVar1,(longlong *)&local_a8);
        plVar2 = local_c0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        plVar4 = local_c0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        *iVar1._M_current =
             (longlong)
             local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->vector_value).
        super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar1._M_current + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)((ulong)((long)plVar4 - (long)plVar2) >> 3));
  }
  convert_base(&local_a8,&__return_storage_ptr__->vector_value,6,base_digits);
  plVar2 = (__return_storage_ptr__->vector_value).
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  if ((plVar2 != (pointer)0x0) &&
     (operator_delete(plVar2),
     local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  trim(&local_50,__return_storage_ptr__);
  if (local_50.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (longlong *)0x0) {
    operator_delete(local_80.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (longlong *)0x0) {
    operator_delete(local_68.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt operator*(const BigInt &v) const { //! multiplication operator overloading
        /* //! works with deque
         BigInt result;
         BigInt This = *this;
         for (long long &vectorValue : that.vector_value) {
             result += This * vectorValue;
             This.vector_value.push_front(0); //! shift the least significant
         }

         return result;*/
        //! log on the value space 24 ms :(
        /* //! log mul
          if (that == __ONE__)
              return (*this);

          BigInt result;
          pair<BigInt, int> halfDiv = that.Half();
          result = (*this) * halfDiv.first;
          result = result.Double();
          //result += result;
          if (halfDiv.second)
              result = result + (*this);
          return result;*/


        vector<long long> a6 = convert_base(this->vector_value, base_digits, 6);
        vector<long long> b6 = convert_base(v.vector_value, base_digits, 6);
        vll a(a6.begin(), a6.end());
        vll b(b6.begin(), b6.end());
        while (a.size() < b.size())
            a.push_back(0);
        while (b.size() < a.size())
            b.push_back(0);
        while (a.size() & (a.size() - 1))
            a.push_back(0), b.push_back(0);
        vll c = karatsubaMultiply(a, b);
        BigInt res;
        res.sign = sign * v.sign;
        for (int i = 0, carry = 0; i < (int) c.size(); i++) {
            long long cur = c[i] + carry;
            res.vector_value.push_back((int) (cur % 1000000));
            carry = (int) (cur / 1000000);
        }
        res.vector_value = convert_base(res.vector_value, 6, base_digits);
        res.trim();
        return res;
    }